

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O0

void __thiscall MonahanPlanner::Plan(MonahanPlanner *this)

{
  bool bVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  size_t sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  reference this_00;
  size_type sVar7;
  DecPOMDPDiscreteInterface *this_01;
  QFunctionsDiscrete *Q_00;
  Belief *this_02;
  long *in_RDI;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *this_03;
  int a_2;
  int a_1;
  int a;
  QFunctionsDiscrete Qs;
  ValueFunctionPOMDPDiscrete immR;
  ValueFunctionPOMDPDiscrete Q0;
  AlphaVector alpha;
  QFunctionsDiscrete Q;
  int nrS;
  int nrA;
  int h;
  AlphaVectorPlanning *in_stack_fffffffffffffd78;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffd80;
  AlphaVectorPlanning *in_stack_fffffffffffffd88;
  allocator_type *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  MonahanPlanner *in_stack_fffffffffffffda0;
  AlphaVectorPlanning *in_stack_fffffffffffffda8;
  string local_140 [36];
  int local_11c;
  string local_118 [36];
  int local_f4;
  undefined1 local_f0 [28];
  int local_d4;
  undefined1 in_stack_ffffffffffffff47;
  pointer in_stack_ffffffffffffff48;
  pointer in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  MonahanPlanner *in_stack_ffffffffffffff60;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_30;
  undefined4 local_14;
  int local_10;
  int local_c;
  
  if ((*(byte *)(in_RDI + 0x2a) & 1) == 0) {
    (**(code **)(*in_RDI + 0x18))();
  }
  if ((*(byte *)((long)in_RDI + 0x151) & 1) == 0) {
    *(undefined1 *)((long)in_RDI + 0x151) = 1;
    pPVar2 = AlphaVectorPlanning::GetPU(in_stack_fffffffffffffd78);
    sVar3 = PlanningUnit::GetHorizon((PlanningUnit *)pPVar2);
    local_c = (int)sVar3;
    AlphaVectorPlanning::GetPU(in_stack_fffffffffffffd78);
    sVar3 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x93da64);
    local_10 = (int)sVar3;
    AlphaVectorPlanning::GetPU(in_stack_fffffffffffffd78);
    sVar3 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffd80);
    local_14 = (undefined4)sVar3;
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              *)0x93da94);
    std::
    allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
    ::allocator((allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
                 *)0x93dab9);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
              *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::operator=((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 *)in_stack_fffffffffffffd90,
                (vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 *)in_stack_fffffffffffffd88);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               *)in_stack_fffffffffffffd90);
    std::
    allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
    ::~allocator((allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
                  *)0x93db16);
    AlphaVector::AlphaVector((AlphaVector *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x93db3a);
    AlphaVectorPlanning::GetImmediateRewardValueFunction(in_stack_fffffffffffffd88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd80,
               (size_type)in_stack_fffffffffffffd78);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)&stack0xffffffffffffff48);
    CheckMaxNrVectors(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                      (size_t)in_stack_ffffffffffffff50);
    *(int *)((long)in_RDI + 300) = local_c + -1;
    while (-1 < *(int *)((long)in_RDI + 300)) {
      if (*(int *)((long)in_RDI + 300) == local_c + -1) {
        AlphaVectorPlanning::ValueFunctionToQ
                  (in_stack_fffffffffffffda8,(ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffffda0
                  );
        for (local_d4 = 0; local_d4 != local_10; local_d4 = local_d4 + 1) {
          std::
          vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
          ::operator[]((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                        *)(in_RDI + 0x27),(long)(local_c + -1));
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::operator[]((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                        *)&stack0xffffffffffffff30,(long)local_d4);
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::push_back((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
        }
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffffd90);
      }
      else {
        pvVar6 = std::
                 vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                               *)(in_RDI + 0x27),(long)(*(int *)((long)in_RDI + 300) + 1));
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
        (**(code **)(*in_RDI + 0x10))(local_f0,in_RDI,pvVar6,*pvVar4);
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     *)in_stack_fffffffffffffd90,
                    (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     *)in_stack_fffffffffffffd88);
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffffd90);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
        GetNrVectors(in_stack_fffffffffffffda0);
        CheckMaxNrVectors(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                          (size_t)in_stack_ffffffffffffff50);
        for (local_f4 = 0; local_f4 != local_10; local_f4 = local_f4 + 1) {
          std::
          vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
          ::operator[]((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                        *)(in_RDI + 0x27),(long)*(int *)((long)in_RDI + 300));
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::operator[](&local_30,(long)local_f4);
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::push_back((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       *)in_stack_fffffffffffffd90,(value_type *)in_stack_fffffffffffffd88);
        }
      }
      (**(code **)(*in_RDI + 0x30))(local_118);
      poVar5 = std::operator<<((ostream *)&std::cout,local_118);
      poVar5 = std::operator<<(poVar5,"Planner: t ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)((long)in_RDI + 300));
      std::operator<<(poVar5," contains <");
      std::__cxx11::string::~string(local_118);
      for (local_11c = 0; local_11c != local_10; local_11c = local_11c + 1) {
        poVar5 = std::operator<<((ostream *)&std::cout," ");
        pvVar6 = std::
                 vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                               *)(in_RDI + 0x27),(long)*(int *)((long)in_RDI + 300));
        this_00 = std::
                  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  ::operator[](pvVar6,(long)local_11c);
        sVar7 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(this_00);
        std::ostream::operator<<(poVar5,sVar7);
      }
      poVar5 = std::operator<<((ostream *)&std::cout," > vectors (total ");
      sVar3 = GetNrVectors(in_stack_fffffffffffffda0);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
      poVar5 = std::operator<<(poVar5,")");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      *(int *)((long)in_RDI + 300) = *(int *)((long)in_RDI + 300) + -1;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
    if (bVar1) {
      AlphaVectorPlanning::ExportValueFunction
                ((string *)in_stack_ffffffffffffff50,
                 (QFunctionsDiscreteNonStationary *)in_stack_ffffffffffffff48,
                 (bool)in_stack_ffffffffffffff47);
    }
    (**(code **)(*in_RDI + 0x30))(local_140);
    poVar5 = std::operator<<((ostream *)&std::cout,local_140);
    poVar5 = std::operator<<(poVar5,"Planner[h=");
    pPVar2 = AlphaVectorPlanning::GetPU(in_stack_fffffffffffffd78);
    sVar3 = PlanningUnit::GetHorizon((PlanningUnit *)pPVar2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar3);
    poVar5 = std::operator<<(poVar5,"]: Vjb0=");
    pPVar2 = AlphaVectorPlanning::GetPU(in_stack_fffffffffffffd78);
    this_01 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD(pPVar2);
    Q_00 = (QFunctionsDiscrete *)
           (**(code **)(*(long *)(&this_01->field_0x0 + *(long *)(*(long *)this_01 + -0xb8)) + 0x50)
           )(&this_01->field_0x0 + *(long *)(*(long *)this_01 + -0xb8));
    ::Belief::Belief((Belief *)this_01,(StateDistribution *)Q_00);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                  *)(in_RDI + 0x27),0);
    this_03 = (vector<AlphaVector,_std::allocator<AlphaVector>_> *)
              BeliefValue::GetValue((BeliefInterface *)this_01,Q_00);
    this_02 = (Belief *)std::ostream::operator<<(poVar5,(double)this_03);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    ::Belief::~Belief(this_02);
    std::__cxx11::string::~string(local_140);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(this_03);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(this_03);
    AlphaVector::~AlphaVector((AlphaVector *)0x93e2e8);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               *)this_03);
  }
  return;
}

Assistant:

void MonahanPlanner::Plan()
{
    if(!MonahanPlanner::_m_initialized)
        Initialize();
    if(_m_alreadyComputed)
        return;
    _m_alreadyComputed=true;

    int h=GetPU()->GetHorizon(),nrA=GetPU()->GetNrJointActions(),
        nrS=GetPU()->GetNrStates();
    QFunctionsDiscrete Q;

    _m_qFunction=vector<QFunctionsDiscrete>(h);

    AlphaVector alpha(nrS);
    ValueFunctionPOMDPDiscrete Q0;

    ValueFunctionPOMDPDiscrete immR=GetImmediateRewardValueFunction();
    CheckMaxNrVectors(_m_maxNrAlphas.at(h-1),immR.size());

    _m_timeStep=h-1;
    while(_m_timeStep>=0)
    {
        if(_m_timeStep==h-1) // last time step, copy in immediate reward function
        {
            QFunctionsDiscrete Qs=ValueFunctionToQ(immR);
            for(int a=0;a!=nrA;a++)
                _m_qFunction[h-1].push_back(Qs[a]);
        }
        else
        {
            Q=BackupStage(_m_qFunction[_m_timeStep+1],_m_maxNrAlphas.at(_m_timeStep));

            CheckMaxNrVectors(_m_maxNrAlphas.at(_m_timeStep),GetNrVectors());
            for(int a=0;a!=nrA;a++)
                _m_qFunction[_m_timeStep].push_back(Q[a]);
        }

        cout << SoftPrintBrief() << "Planner: t " << _m_timeStep << " contains <";
        for(int a=0;a!=nrA;a++)
            cout << " " << _m_qFunction[_m_timeStep][a].size();
        cout << " > vectors (total "
             << GetNrVectors() << ")" << endl;
        _m_timeStep--;
    }

    if(_m_resultsFilename!="")
        ExportValueFunction(_m_resultsFilename,_m_qFunction);

    cout << SoftPrintBrief() << "Planner[h=" 
         << GetPU()->GetHorizon() << "]: Vjb0="
         << BeliefValue::GetValue(Belief(*GetPU()->GetDPOMDPD()->GetISD()),
                                  _m_qFunction[0])
         << endl;
}